

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPathMatcher.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XPathMatcher::startElement
          (XPathMatcher *this,XMLElementDecl *elemDecl,uint urlId,XMLCh *elemPrefix,
          RefVectorOf<xercesc_4_0::XMLAttr> *attrList,XMLSize_t attrCount,
          ValidationContext *validationContext)

{
  ulong uVar1;
  ulong uVar2;
  RefVectorOf<xercesc_4_0::XMLAttr> *prefix_00;
  SchemaElementDecl *this_00;
  unsigned_short uVar3;
  uint uriId;
  ValidatorType VVar4;
  int iVar5;
  ValueStackOf<unsigned_long> *this_01;
  XercesLocationPath *this_02;
  XMLSize_t XVar6;
  XercesStep *pXVar7;
  QName *pQVar8;
  XMLCh *pXVar9;
  XercesNodeTest *nodeTest_00;
  XMLAttr *this_03;
  SchemaAttDef *this_04;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool bVar10;
  DatatypeValidator *local_198;
  undefined1 local_158 [8];
  ArrayJanitor<char16_t> janPrefix;
  XMLCh *prefix;
  XMLBuffer buff;
  int index;
  XMLCh *value;
  DatatypeValidator *dv;
  SchemaAttDef *attDef;
  XMLAttr *curDef;
  XMLSize_t attrIndex;
  XercesNodeTest *nodeTest_1;
  undefined1 local_c0 [8];
  QName elemQName;
  XercesNodeTest *nodeTest;
  XercesStep *step;
  bool sawDescendant;
  XMLSize_t descendantStep;
  XMLSize_t stepSize;
  XercesLocationPath *locPath;
  XMLSize_t startStep;
  XMLSize_t i;
  XMLSize_t attrCount_local;
  RefVectorOf<xercesc_4_0::XMLAttr> *attrList_local;
  XMLCh *elemPrefix_local;
  SchemaElementDecl *pSStack_18;
  uint urlId_local;
  XMLElementDecl *elemDecl_local;
  XPathMatcher *this_local;
  
  startStep = 0;
  i = attrCount;
  attrCount_local = (XMLSize_t)attrList;
  attrList_local = (RefVectorOf<xercesc_4_0::XMLAttr> *)elemPrefix;
  elemPrefix_local._4_4_ = urlId;
  pSStack_18 = (SchemaElementDecl *)elemDecl;
  elemDecl_local = (XMLElementDecl *)this;
  do {
    if (this->fLocationPathSize <= startStep) {
      return;
    }
    locPath = (XercesLocationPath *)this->fCurrentStep[startStep];
    this_01 = BaseRefVectorOf<xercesc_4_0::ValueStackOf<unsigned_long>_>::elementAt
                        (&this->fStepIndexes->
                          super_BaseRefVectorOf<xercesc_4_0::ValueStackOf<unsigned_long>_>,startStep
                        );
    ValueStackOf<unsigned_long>::push(this_01,(unsigned_long *)&locPath);
    if (((this->fMatched[startStep] & 5) == 1) || (this->fNoMatchDepth[startStep] != 0)) {
      this->fNoMatchDepth[startStep] = this->fNoMatchDepth[startStep] + 1;
    }
    else {
      if ((this->fMatched[startStep] & 5) == 5) {
        this->fMatched[startStep] = '\r';
      }
      this_02 = BaseRefVectorOf<xercesc_4_0::XercesLocationPath>::elementAt
                          (&this->fLocationPaths->
                            super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>,startStep);
      XVar6 = XercesLocationPath::getStepSize(this_02);
      while( true ) {
        bVar10 = false;
        if (this->fCurrentStep[startStep] < XVar6) {
          pXVar7 = XercesLocationPath::getStep(this_02,this->fCurrentStep[startStep]);
          uVar3 = XercesStep::getAxisType(pXVar7);
          bVar10 = uVar3 == 3;
        }
        if (!bVar10) break;
        this->fCurrentStep[startStep] = this->fCurrentStep[startStep] + 1;
      }
      if (this->fCurrentStep[startStep] == XVar6) {
        this->fMatched[startStep] = '\x01';
      }
      else {
        uVar1 = this->fCurrentStep[startStep];
        while( true ) {
          bVar10 = false;
          if (this->fCurrentStep[startStep] < XVar6) {
            pXVar7 = XercesLocationPath::getStep(this_02,this->fCurrentStep[startStep]);
            uVar3 = XercesStep::getAxisType(pXVar7);
            bVar10 = uVar3 == 4;
          }
          if (!bVar10) break;
          this->fCurrentStep[startStep] = this->fCurrentStep[startStep] + 1;
        }
        uVar2 = this->fCurrentStep[startStep];
        if (this->fCurrentStep[startStep] == XVar6) {
          this->fNoMatchDepth[startStep] = this->fNoMatchDepth[startStep] + 1;
        }
        else {
          if (((XercesLocationPath *)this->fCurrentStep[startStep] == locPath) ||
             (uVar1 < this->fCurrentStep[startStep])) {
            pXVar7 = XercesLocationPath::getStep(this_02,this->fCurrentStep[startStep]);
            uVar3 = XercesStep::getAxisType(pXVar7);
            if (uVar3 == 1) {
              pXVar7 = XercesLocationPath::getStep(this_02,this->fCurrentStep[startStep]);
              elemQName.fMemoryManager = (MemoryManager *)XercesStep::getNodeTest(pXVar7);
              prefix_00 = attrList_local;
              pQVar8 = XMLElementDecl::getElementName(&pSStack_18->super_XMLElementDecl);
              pXVar9 = QName::getLocalPart(pQVar8);
              QName::QName((QName *)local_c0,(XMLCh *)prefix_00,pXVar9,elemPrefix_local._4_4_,
                           this->fMemoryManager);
              bVar10 = matches(this,(XercesNodeTest *)elemQName.fMemoryManager,(QName *)local_c0);
              if (bVar10) {
                this->fCurrentStep[startStep] = this->fCurrentStep[startStep] + 1;
                bVar10 = false;
              }
              else if (uVar1 < this->fCurrentStep[startStep]) {
                this->fCurrentStep[startStep] = uVar1;
                bVar10 = true;
              }
              else {
                this->fNoMatchDepth[startStep] = this->fNoMatchDepth[startStep] + 1;
                bVar10 = true;
              }
              QName::~QName((QName *)local_c0);
              if (bVar10) goto LAB_00410d3c;
            }
          }
          if (this->fCurrentStep[startStep] == XVar6) {
            if (uVar1 < uVar2) {
              this->fCurrentStep[startStep] = uVar1;
              this->fMatched[startStep] = '\x05';
            }
            else {
              this->fMatched[startStep] = '\x01';
            }
          }
          else if (this->fCurrentStep[startStep] < XVar6) {
            pXVar7 = XercesLocationPath::getStep(this_02,this->fCurrentStep[startStep]);
            uVar3 = XercesStep::getAxisType(pXVar7);
            if (uVar3 == 2) {
              if (i != 0) {
                pXVar7 = XercesLocationPath::getStep(this_02,this->fCurrentStep[startStep]);
                nodeTest_00 = XercesStep::getNodeTest(pXVar7);
                for (curDef = (XMLAttr *)0x0; curDef < i; curDef = (XMLAttr *)&curDef->field_0x1) {
                  this_03 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                                      ((BaseRefVectorOf<xercesc_4_0::XMLAttr> *)attrCount_local,
                                       (XMLSize_t)curDef);
                  pQVar8 = XMLAttr::getAttName(this_03);
                  bVar10 = matches(this,nodeTest_00,pQVar8);
                  this_00 = pSStack_18;
                  if (bVar10) {
                    this->fCurrentStep[startStep] = this->fCurrentStep[startStep] + 1;
                    if (this->fCurrentStep[startStep] == XVar6) {
                      this->fMatched[startStep] = '\x03';
                      pXVar9 = XMLAttr::getName(this_03);
                      uriId = XMLAttr::getURIId(this_03);
                      this_04 = SchemaElementDecl::getAttDef(this_00,pXVar9,uriId);
                      if (this_04 == (SchemaAttDef *)0x0) {
                        local_198 = (DatatypeValidator *)0x0;
                      }
                      else {
                        local_198 = SchemaAttDef::getDatatypeValidator(this_04);
                      }
                      pXVar9 = XMLAttr::getValue(this_03);
                      if ((local_198 == (DatatypeValidator *)0x0) ||
                         (VVar4 = DatatypeValidator::getType(local_198), VVar4 != QName)) {
                        (*this->_vptr_XPathMatcher[6])(this,pXVar9,local_198,0);
                      }
                      else {
                        buff.fBuffer._4_4_ = XMLString::indexOf(pXVar9,L':');
                        if (buff.fBuffer._4_4_ == -1) {
                          (*this->_vptr_XPathMatcher[6])(this,pXVar9,local_198,0);
                        }
                        else {
                          XMLBuffer::XMLBuffer((XMLBuffer *)&prefix,0x3ff,this->fMemoryManager);
                          XMLBuffer::append((XMLBuffer *)&prefix,L'{');
                          if (validationContext != (ValidationContext *)0x0) {
                            iVar5 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                                              (this->fMemoryManager,(long)buff.fBuffer._4_4_ * 2 + 2
                                              );
                            janPrefix.fMemoryManager = (MemoryManager *)CONCAT44(extraout_var,iVar5)
                            ;
                            ArrayJanitor<char16_t>::ArrayJanitor
                                      ((ArrayJanitor<char16_t> *)local_158,
                                       (char16_t *)janPrefix.fMemoryManager,this->fMemoryManager);
                            XMLString::subString
                                      ((XMLCh *)janPrefix.fMemoryManager,pXVar9,0,
                                       (long)buff.fBuffer._4_4_,this->fMemoryManager);
                            iVar5 = (*validationContext->_vptr_ValidationContext[0xf])
                                              (validationContext,janPrefix.fMemoryManager);
                            XMLBuffer::append((XMLBuffer *)&prefix,
                                              (XMLCh *)CONCAT44(extraout_var_00,iVar5));
                            ArrayJanitor<char16_t>::~ArrayJanitor
                                      ((ArrayJanitor<char16_t> *)local_158);
                          }
                          XMLBuffer::append((XMLBuffer *)&prefix,L'}');
                          XMLBuffer::append((XMLBuffer *)&prefix,
                                            pXVar9 + (long)buff.fBuffer._4_4_ + 1);
                          pXVar9 = XMLBuffer::getRawBuffer((XMLBuffer *)&prefix);
                          (*this->_vptr_XPathMatcher[6])(this,pXVar9,local_198,0);
                          XMLBuffer::~XMLBuffer((XMLBuffer *)&prefix);
                        }
                      }
                    }
                    break;
                  }
                }
              }
              if ((this->fMatched[startStep] & 1) != 1) {
                if (uVar1 < this->fCurrentStep[startStep]) {
                  this->fCurrentStep[startStep] = uVar1;
                }
                else {
                  this->fNoMatchDepth[startStep] = this->fNoMatchDepth[startStep] + 1;
                }
              }
            }
          }
        }
      }
    }
LAB_00410d3c:
    startStep = startStep + 1;
  } while( true );
}

Assistant:

void XPathMatcher::startElement(const XMLElementDecl& elemDecl,
                                const unsigned int urlId,
                                const XMLCh* const elemPrefix,
								const RefVectorOf<XMLAttr>& attrList,
                                const XMLSize_t attrCount,
                                ValidationContext* validationContext /*=0*/) {

    for (XMLSize_t i = 0; i < fLocationPathSize; i++) {

        // push context
        XMLSize_t startStep = fCurrentStep[i];
        fStepIndexes->elementAt(i)->push(startStep);

        // try next xpath, if not matching
        if ((fMatched[i] & XP_MATCHED_D) == XP_MATCHED || fNoMatchDepth[i] > 0) {
            fNoMatchDepth[i]++;
            continue;
        }

        if((fMatched[i] & XP_MATCHED_D) == XP_MATCHED_D) {
            fMatched[i] = XP_MATCHED_DP;
        }

        // consume self::node() steps
        XercesLocationPath* locPath = fLocationPaths->elementAt(i);
        XMLSize_t stepSize = locPath->getStepSize();

        while (fCurrentStep[i] < stepSize &&
               locPath->getStep(fCurrentStep[i])->getAxisType() == XercesStep::AxisType_SELF) {
            fCurrentStep[i]++;
        }

        if (fCurrentStep[i] == stepSize) {

            fMatched[i] = XP_MATCHED;
            continue;
        }

        // now if the current step is a descendant step, we let the next
        // step do its thing; if it fails, we reset ourselves
        // to look at this step for next time we're called.
        // so first consume all descendants:
        XMLSize_t descendantStep = fCurrentStep[i];

        while (fCurrentStep[i] < stepSize &&
               locPath->getStep(fCurrentStep[i])->getAxisType() == XercesStep::AxisType_DESCENDANT) {
            fCurrentStep[i]++;
        }

        bool sawDescendant = fCurrentStep[i] > descendantStep;
        if (fCurrentStep[i] == stepSize) {

            fNoMatchDepth[i]++;
            continue;
        }

        // match child::... step, if haven't consumed any self::node()
        if ((fCurrentStep[i] == startStep || fCurrentStep[i] > descendantStep) &&
            locPath->getStep(fCurrentStep[i])->getAxisType() == XercesStep::AxisType_CHILD) {

            XercesStep* step = locPath->getStep(fCurrentStep[i]);
            XercesNodeTest* nodeTest = step->getNodeTest();

            QName elemQName(elemPrefix, elemDecl.getElementName()->getLocalPart(), urlId, fMemoryManager);
            if (!matches(nodeTest, &elemQName)) {

                if(fCurrentStep[i] > descendantStep) {
                    fCurrentStep[i] = descendantStep;
                    continue;
                }

                fNoMatchDepth[i]++;
                continue;
            }

            fCurrentStep[i]++;
        }

        if (fCurrentStep[i] == stepSize) {

            if (sawDescendant) {

                fCurrentStep[i] = descendantStep;
                fMatched[i] = XP_MATCHED_D;
            }
            else {
                fMatched[i] = XP_MATCHED;
            }

            continue;
        }

        // match attribute::... step
        if (fCurrentStep[i] < stepSize &&
            locPath->getStep(fCurrentStep[i])->getAxisType() == XercesStep::AxisType_ATTRIBUTE) {

            if (attrCount) {

                XercesNodeTest* nodeTest = locPath->getStep(fCurrentStep[i])->getNodeTest();

                for (XMLSize_t attrIndex = 0; attrIndex < attrCount; attrIndex++) {

                    const XMLAttr* curDef = attrList.elementAt(attrIndex);

                    if (matches(nodeTest, curDef->getAttName())) {

                        fCurrentStep[i]++;

                        if (fCurrentStep[i] == stepSize) {

                            fMatched[i] = XP_MATCHED_A;

                            SchemaAttDef* attDef = ((SchemaElementDecl&) elemDecl).getAttDef(curDef->getName(), curDef->getURIId());
                            DatatypeValidator* dv = (attDef) ? attDef->getDatatypeValidator() : 0;
                            const XMLCh* value = curDef->getValue();
                            // store QName using their Clark name
                            if(dv && dv->getType()==DatatypeValidator::QName)
                            {
                                int index=XMLString::indexOf(value, chColon);
                                if(index==-1)
                                    matched(value, dv, false);
                                else
                                {
                                    XMLBuffer buff(1023, fMemoryManager);
                                    buff.append(chOpenCurly);
                                    if(validationContext)
                                    {
                                        XMLCh* prefix=(XMLCh*)fMemoryManager->allocate((index+1)*sizeof(XMLCh));
                                        ArrayJanitor<XMLCh> janPrefix(prefix, fMemoryManager);
                                        XMLString::subString(prefix, value, 0, (XMLSize_t)index, fMemoryManager);
                                        buff.append(validationContext->getURIForPrefix(prefix));
                                    }
                                    buff.append(chCloseCurly);
                                    buff.append(value+index+1);
                                    matched(buff.getRawBuffer(), dv, false);
                                }
                            }
                            else
                                matched(value, dv, false);
                        }
                        break;
                    }
                }
            }

            if ((fMatched[i] & XP_MATCHED) != XP_MATCHED) {

                if(fCurrentStep[i] > descendantStep) {

                    fCurrentStep[i] = descendantStep;
                    continue;
                }

                fNoMatchDepth[i]++;
            }
        }
    }
}